

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-data.hpp
# Opt level: O2

void __thiscall helics::Message::Message(Message *this)

{
  SmallBuffer *pSVar1;
  
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[0x30] = 0;
  (pSVar1->buffer)._M_elems[0x31] = 0;
  (pSVar1->buffer)._M_elems[0x32] = 0;
  (pSVar1->buffer)._M_elems[0x33] = 0;
  (pSVar1->buffer)._M_elems[0x34] = 0;
  (pSVar1->buffer)._M_elems[0x35] = 0;
  (pSVar1->buffer)._M_elems[0x36] = 0;
  (pSVar1->buffer)._M_elems[0x37] = 0;
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[0x38] = 0;
  (pSVar1->buffer)._M_elems[0x39] = 0;
  (pSVar1->buffer)._M_elems[0x3a] = 0;
  (pSVar1->buffer)._M_elems[0x3b] = 0;
  (pSVar1->buffer)._M_elems[0x3c] = 0;
  (pSVar1->buffer)._M_elems[0x3d] = 0;
  (pSVar1->buffer)._M_elems[0x3e] = 0;
  (pSVar1->buffer)._M_elems[0x3f] = 0;
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[0x20] = 0;
  (pSVar1->buffer)._M_elems[0x21] = 0;
  (pSVar1->buffer)._M_elems[0x22] = 0;
  (pSVar1->buffer)._M_elems[0x23] = 0;
  (pSVar1->buffer)._M_elems[0x24] = 0;
  (pSVar1->buffer)._M_elems[0x25] = 0;
  (pSVar1->buffer)._M_elems[0x26] = 0;
  (pSVar1->buffer)._M_elems[0x27] = 0;
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[0x28] = 0;
  (pSVar1->buffer)._M_elems[0x29] = 0;
  (pSVar1->buffer)._M_elems[0x2a] = 0;
  (pSVar1->buffer)._M_elems[0x2b] = 0;
  (pSVar1->buffer)._M_elems[0x2c] = 0;
  (pSVar1->buffer)._M_elems[0x2d] = 0;
  (pSVar1->buffer)._M_elems[0x2e] = 0;
  (pSVar1->buffer)._M_elems[0x2f] = 0;
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[0x10] = 0;
  (pSVar1->buffer)._M_elems[0x11] = 0;
  (pSVar1->buffer)._M_elems[0x12] = 0;
  (pSVar1->buffer)._M_elems[0x13] = 0;
  (pSVar1->buffer)._M_elems[0x14] = 0;
  (pSVar1->buffer)._M_elems[0x15] = 0;
  (pSVar1->buffer)._M_elems[0x16] = 0;
  (pSVar1->buffer)._M_elems[0x17] = 0;
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[0x18] = 0;
  (pSVar1->buffer)._M_elems[0x19] = 0;
  (pSVar1->buffer)._M_elems[0x1a] = 0;
  (pSVar1->buffer)._M_elems[0x1b] = 0;
  (pSVar1->buffer)._M_elems[0x1c] = 0;
  (pSVar1->buffer)._M_elems[0x1d] = 0;
  (pSVar1->buffer)._M_elems[0x1e] = 0;
  (pSVar1->buffer)._M_elems[0x1f] = 0;
  (this->data).bufferSize = 0;
  (this->data).buffer._M_elems[0] = 0;
  (this->data).buffer._M_elems[1] = 0;
  (this->data).buffer._M_elems[2] = 0;
  (this->data).buffer._M_elems[3] = 0;
  (this->data).buffer._M_elems[4] = 0;
  (this->data).buffer._M_elems[5] = 0;
  (this->data).buffer._M_elems[6] = 0;
  (this->data).buffer._M_elems[7] = 0;
  pSVar1 = &this->data;
  (pSVar1->buffer)._M_elems[8] = 0;
  (pSVar1->buffer)._M_elems[9] = 0;
  (pSVar1->buffer)._M_elems[10] = 0;
  (pSVar1->buffer)._M_elems[0xb] = 0;
  (pSVar1->buffer)._M_elems[0xc] = 0;
  (pSVar1->buffer)._M_elems[0xd] = 0;
  (pSVar1->buffer)._M_elems[0xe] = 0;
  (pSVar1->buffer)._M_elems[0xf] = 0;
  (this->time).internalTimeCode = 0;
  this->flags = 0;
  this->messageValidation = 0;
  this->messageID = 0;
  (this->data).bufferCapacity = 0x40;
  (this->data).heap = (byte *)&this->data;
  (this->data).nonOwning = false;
  (this->data).locked = false;
  (this->data).usingAllocatedBuffer = false;
  (this->data).errorCondition = '\0';
  (this->data).userKey = 0;
  (this->dest)._M_dataplus._M_p = (pointer)&(this->dest).field_2;
  (this->dest)._M_string_length = 0;
  (this->dest).field_2._M_local_buf[0] = '\0';
  (this->source)._M_dataplus._M_p = (pointer)&(this->source).field_2;
  (this->source)._M_string_length = 0;
  (this->source).field_2._M_local_buf[0] = '\0';
  (this->original_source)._M_dataplus._M_p = (pointer)&(this->original_source).field_2;
  (this->original_source)._M_string_length = 0;
  (this->original_source).field_2._M_local_buf[0] = '\0';
  (this->original_dest)._M_dataplus._M_p = (pointer)&(this->original_dest).field_2;
  (this->original_dest)._M_string_length = 0;
  (this->original_dest).field_2._M_local_buf[0] = '\0';
  this->counter = 0;
  this->backReference = (void *)0x0;
  return;
}

Assistant:

Message() = default;